

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  _Base_ptr in_RCX;
  size_t start_memory;
  uint uVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  EasyUseMap<HashObject<16,_16>,_int> set;
  key_type local_70;
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::chrono::_V2::steady_clock::now();
  if (0 < iters) {
    uVar6 = 0;
    do {
      in_RCX = (_Base_ptr)0x101010101010101;
      local_70.buffer_._0_8_ = (ulong)(uVar6 & 0xff) * 0x101010101010101;
      local_70.buffer_._8_4_ = SUB84(local_70.buffer_._0_8_,0);
      local_70.i_ = uVar6;
      puVar3 = (uint *)std::
                       map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                       ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                     *)&local_60,&local_70);
      uVar6 = uVar6 + 1;
      *puVar3 = uVar6;
    } while (iters != uVar6);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar4 = std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    uVar7 = 0;
    do {
      iVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      p_Var8 = &p_Var1->_M_header;
      for (p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
          p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < iVar2]) {
        if (iVar2 <= (int)*(size_t *)(p_Var9 + 1)) {
          p_Var8 = p_Var9;
        }
      }
      p_Var9 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var9 = p_Var8, iVar2 < (int)p_Var8[1]._M_color)) {
        p_Var9 = &p_Var1->_M_header;
      }
      uVar6 = uVar6 ^ (_Rb_tree_header *)p_Var9 != p_Var1;
      uVar7 = uVar7 + 1;
      in_RCX = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (uVar7 != (uint)iters);
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  srand(uVar6);
  report(title,(double)(lVar5 - lVar4),iters,start_memory,(size_t)in_RCX);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}